

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int8_suite::fail_array8_int8_missing_length(void)

{
  value_type input [1];
  decoder decoder;
  uchar local_39 [1];
  undefined4 local_38;
  value local_34;
  decoder local_30;
  
  local_39[0] = 0xa8;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[1]>(&local_30,&local_39);
  local_34 = local_30.current.code;
  local_38 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x5a1,"void compact_int8_suite::fail_array8_int8_missing_length()",&local_34,&local_38
            );
  return;
}

Assistant:

void fail_array8_int8_missing_length()
{
    const value_type input[] = { token::code::array8_int8 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}